

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O3

void Mop_ManReduce(Mop_Man_t *p)

{
  ulong uVar1;
  uint uVar2;
  void *__ptr;
  int iVar3;
  int iVar4;
  Vec_Wec_t *__ptr_00;
  long lVar5;
  long lVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *vGroup;
  uint uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  Vec_Int_t *vGroup2;
  timespec ts;
  uint local_74;
  long local_68;
  timespec local_48;
  Vec_Int_t *local_38;
  
  iVar3 = clock_gettime(3,&local_48);
  if (iVar3 < 0) {
    local_68 = 1;
  }
  else {
    lVar5 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    local_68 = ((lVar5 >> 7) - (lVar5 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  __ptr_00 = Mop_ManCreateGroups(p);
  lVar5 = (long)p->vCubes->nSize;
  uVar8 = 0;
  if (0 < lVar5) {
    uVar15 = p->nWordsOut;
    lVar10 = 0;
    uVar8 = 0;
    do {
      uVar11 = p->vCubes->pArray[lVar10] * uVar15;
      if (((int)uVar11 < 0) || (p->vWordsOut->nSize <= (int)uVar11)) goto LAB_00336c5a;
      if ((int)uVar15 < 1) {
        iVar3 = 0;
      }
      else {
        uVar13 = 0;
        iVar3 = 0;
        do {
          uVar14 = p->vWordsOut->pArray[uVar11 + uVar13];
          uVar14 = uVar14 - (uVar14 >> 1 & 0x5555555555555555);
          uVar14 = (uVar14 >> 2 & 0x3333333333333333) + (uVar14 & 0x3333333333333333);
          uVar14 = (uVar14 >> 4) + uVar14 & 0xf0f0f0f0f0f0f0f;
          uVar14 = (uVar14 >> 8) + uVar14;
          lVar6 = (uVar14 >> 0x10) + uVar14;
          iVar3 = iVar3 + ((int)((ulong)lVar6 >> 0x20) + (int)lVar6 & 0xffU);
          uVar13 = uVar13 + 1;
        } while (uVar15 != uVar13);
      }
      uVar8 = uVar8 + iVar3;
      lVar10 = lVar10 + 1;
    } while (lVar10 != lVar5);
  }
  local_74 = 0;
  iVar3 = __ptr_00->nSize;
  uVar13 = (ulong)iVar3;
  uVar15 = 0;
  if (0 < (long)uVar13) {
    pVVar7 = __ptr_00->pArray;
    local_74 = 0;
    uVar14 = uVar13;
    do {
      iVar4 = Mop_ManRemoveIdentical(p,pVVar7);
      local_74 = local_74 + iVar4;
      pVVar7 = pVVar7 + 1;
      uVar14 = uVar14 - 1;
    } while (uVar14 != 0);
    if (0 < iVar3) {
      pVVar7 = __ptr_00->pArray;
      uVar9 = 1;
      uVar15 = 0;
      uVar14 = 0;
      local_38 = pVVar7;
      do {
        pVVar7 = pVVar7 + 1;
        uVar1 = uVar14 + 1;
        if (uVar1 < uVar13) {
          vGroup = local_38 + uVar14;
          uVar14 = uVar13;
          vGroup2 = pVVar7;
          do {
            iVar4 = Mop_ManMergeContainTwo(p,vGroup,vGroup2);
            uVar15 = uVar15 + iVar4;
            vGroup2 = vGroup2 + 1;
            uVar14 = uVar14 - 1;
          } while (uVar9 != uVar14);
        }
        uVar9 = uVar9 + 1;
        uVar14 = uVar1;
      } while (uVar1 != uVar13);
    }
  }
  pVVar7 = p->vCubes;
  if ((long)pVVar7->nSize < 1) {
    uVar11 = 0;
  }
  else {
    uVar2 = p->nWordsOut;
    lVar5 = 0;
    uVar11 = 0;
    do {
      uVar12 = pVVar7->pArray[lVar5] * uVar2;
      if (((int)uVar12 < 0) || (p->vWordsOut->nSize <= (int)uVar12)) {
LAB_00336c5a:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      if ((int)uVar2 < 1) {
        iVar4 = 0;
      }
      else {
        uVar14 = 0;
        iVar4 = 0;
        do {
          uVar9 = p->vWordsOut->pArray[uVar12 + uVar14];
          uVar9 = uVar9 - (uVar9 >> 1 & 0x5555555555555555);
          uVar9 = (uVar9 >> 2 & 0x3333333333333333) + (uVar9 & 0x3333333333333333);
          uVar9 = (uVar9 >> 4) + uVar9 & 0xf0f0f0f0f0f0f0f;
          uVar9 = (uVar9 >> 8) + uVar9;
          lVar10 = (uVar9 >> 0x10) + uVar9;
          iVar4 = iVar4 + ((int)((ulong)lVar10 >> 0x20) + (int)lVar10 & 0xffU);
          uVar14 = uVar14 + 1;
        } while (uVar2 != uVar14);
      }
      uVar11 = uVar11 + iVar4;
      lVar5 = lVar5 + 1;
    } while (lVar5 != pVVar7->nSize);
  }
  pVVar7->nSize = 0;
  pVVar7 = __ptr_00->pArray;
  if (0 < iVar3) {
    uVar14 = 0;
    do {
      iVar3 = pVVar7[uVar14].nSize;
      if (0 < iVar3) {
        lVar5 = 0;
        do {
          if (pVVar7[uVar14].pArray[lVar5] != -1) {
            Vec_IntPush(p->vCubes,pVVar7[uVar14].pArray[lVar5]);
            iVar3 = pVVar7[uVar14].nSize;
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 < iVar3);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != uVar13);
  }
  iVar3 = __ptr_00->nCap;
  if ((long)iVar3 < 1) {
    if (pVVar7 == (Vec_Int_t *)0x0) goto LAB_00336b94;
  }
  else {
    lVar5 = 0;
    do {
      __ptr = *(void **)((long)&pVVar7->pArray + lVar5);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)&pVVar7->pArray + lVar5) = 0;
      }
      lVar5 = lVar5 + 0x10;
    } while ((long)iVar3 * 0x10 != lVar5);
  }
  free(pVVar7);
LAB_00336b94:
  free(__ptr_00);
  printf("Total = %d. Reduced %d equal and %d contained cubes. Output lits: %d -> %d.   ",
         (ulong)(uint)p->vCubes->nSize,(ulong)local_74,(ulong)uVar15,(ulong)uVar8,(ulong)uVar11);
  iVar3 = clock_gettime(3,&local_48);
  if (iVar3 < 0) {
    lVar5 = -1;
  }
  else {
    lVar5 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
  }
  Abc_Print(1,"%s =","Time");
  Abc_Print(1,"%9.2f sec\n",(double)(lVar5 + local_68) / 1000000.0);
  return;
}

Assistant:

void Mop_ManReduce( Mop_Man_t * p )
{
    abctime clk = Abc_Clock();
    Vec_Int_t * vGroup, * vGroup2;
    int i, k, nOutLits, nOutLits2, nEqual = 0, nContain = 0;
    Vec_Wec_t * vGroups = Mop_ManCreateGroups( p );
    // initial stats
    nOutLits = Mop_ManCountOutputLits( p );
    // check identical cubes within each group
    Vec_WecForEachLevel( vGroups, vGroup, i )
        nEqual += Mop_ManRemoveIdentical( p, vGroup );
    // check contained cubes
    Vec_WecForEachLevel( vGroups, vGroup, i )
        Vec_WecForEachLevelStart( vGroups, vGroup2, k, i+1 )
            nContain += Mop_ManMergeContainTwo( p, vGroup, vGroup2 );
    // final stats
    nOutLits2 = Mop_ManCountOutputLits( p );
    Mop_ManUnCreateGroups( p, vGroups );
    Vec_WecFree( vGroups );
    // report
    printf( "Total = %d. Reduced %d equal and %d contained cubes. Output lits: %d -> %d.   ", Vec_IntSize(p->vCubes), nEqual, nContain, nOutLits, nOutLits2 );
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk );
}